

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamReaderPrivate::SetRegion(BamReaderPrivate *this,BamRegion *region)

{
  bool bVar1;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string bracError;
  string message;
  
  bracError._M_dataplus._M_p._0_4_ =
       (undefined4)
       (((long)(this->m_references).
               super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(this->m_references).
              super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x28);
  bVar1 = BamRandomAccessController::SetRegion
                    (&this->m_randomAccessController,region,(int *)&bracError);
  if (!bVar1) {
    BamRandomAccessController::GetErrorString_abi_cxx11_(&bracError,&this->m_randomAccessController)
    ;
    std::__cxx11::string::string((string *)&local_78,"could not set region: \n\t",&local_79);
    std::operator+(&message,&local_78,&bracError);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)&local_78,"BamReader::SetRegion",&local_79);
    SetErrorString(this,&local_78,&message);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&bracError);
  }
  return bVar1;
}

Assistant:

bool BamReaderPrivate::SetRegion(const BamRegion& region)
{

    if (m_randomAccessController.SetRegion(region, m_references.size()))
        return true;
    else {
        const std::string bracError = m_randomAccessController.GetErrorString();
        const std::string message = std::string("could not set region: \n\t") + bracError;
        SetErrorString("BamReader::SetRegion", message);
        return false;
    }
}